

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_pi_update_encode_poc_and_final
               (opj_cp_t *p_cp,OPJ_UINT32 p_tileno,OPJ_INT32 p_tx0,OPJ_INT32 p_tx1,OPJ_INT32 p_ty0,
               OPJ_INT32 p_ty1,OPJ_UINT32 p_max_prec,OPJ_UINT32 p_max_res,OPJ_UINT32 p_dx_min,
               OPJ_UINT32 p_dy_min)

{
  OPJ_UINT32 OVar1;
  opj_tcp_t *poVar2;
  OPJ_UINT32 local_40;
  opj_poc_t *poStack_38;
  OPJ_UINT32 l_poc_bound;
  opj_poc_t *l_current_poc;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 pino;
  OPJ_INT32 p_ty1_local;
  OPJ_INT32 p_ty0_local;
  OPJ_INT32 p_tx1_local;
  OPJ_INT32 p_tx0_local;
  OPJ_UINT32 p_tileno_local;
  opj_cp_t *p_cp_local;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x42e,
                  "void opj_pi_update_encode_poc_and_final(opj_cp_t *, OPJ_UINT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
                 );
  }
  if (p_tileno < p_cp->tw * p_cp->th) {
    poVar2 = p_cp->tcps;
    OVar1 = poVar2[p_tileno].numpocs;
    poVar2[p_tileno].pocs[0].compS = poVar2[p_tileno].pocs[0].compno0;
    poVar2[p_tileno].pocs[0].compE = poVar2[p_tileno].pocs[0].compno1;
    poVar2[p_tileno].pocs[0].resS = poVar2[p_tileno].pocs[0].resno0;
    poVar2[p_tileno].pocs[0].resE = poVar2[p_tileno].pocs[0].resno1;
    poVar2[p_tileno].pocs[0].layE = poVar2[p_tileno].pocs[0].layno1;
    poVar2[p_tileno].pocs[0].layS = 0;
    poVar2[p_tileno].pocs[0].prg = poVar2[p_tileno].pocs[0].prg1;
    poVar2[p_tileno].pocs[0].prcS = 0;
    poVar2[p_tileno].pocs[0].prcE = p_max_prec;
    poVar2[p_tileno].pocs[0].txS = p_tx0;
    poVar2[p_tileno].pocs[0].txE = p_tx1;
    poVar2[p_tileno].pocs[0].tyS = p_ty0;
    poVar2[p_tileno].pocs[0].tyE = p_ty1;
    poVar2[p_tileno].pocs[0].dx = p_dx_min;
    poVar2[p_tileno].pocs[0].dy = p_dy_min;
    poStack_38 = poVar2[p_tileno].pocs;
    for (l_tcp._0_4_ = 1; poStack_38 = poStack_38 + 1, (uint)l_tcp < OVar1 + 1;
        l_tcp._0_4_ = (uint)l_tcp + 1) {
      poStack_38->compS = poStack_38->compno0;
      poStack_38->compE = poStack_38->compno1;
      poStack_38->resS = poStack_38->resno0;
      poStack_38->resE = poStack_38->resno1;
      poStack_38->layE = poStack_38->layno1;
      poStack_38->prg = poStack_38->prg1;
      poStack_38->prcS = 0;
      if (poStack_38[-1].layE < poStack_38->layE) {
        local_40 = poStack_38->layE;
      }
      else {
        local_40 = 0;
      }
      poStack_38->layS = local_40;
      poStack_38->prcE = p_max_prec;
      poStack_38->txS = p_tx0;
      poStack_38->txE = p_tx1;
      poStack_38->tyS = p_ty0;
      poStack_38->tyE = p_ty1;
      poStack_38->dx = p_dx_min;
      poStack_38->dy = p_dy_min;
    }
    return;
  }
  __assert_fail("p_tileno < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x42f,
                "void opj_pi_update_encode_poc_and_final(opj_cp_t *, OPJ_UINT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_INT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
               );
}

Assistant:

static void opj_pi_update_encode_poc_and_final(opj_cp_t *p_cp,
        OPJ_UINT32 p_tileno,
        OPJ_INT32 p_tx0,
        OPJ_INT32 p_tx1,
        OPJ_INT32 p_ty0,
        OPJ_INT32 p_ty1,
        OPJ_UINT32 p_max_prec,
        OPJ_UINT32 p_max_res,
        OPJ_UINT32 p_dx_min,
        OPJ_UINT32 p_dy_min)
{
    /* loop*/
    OPJ_UINT32 pino;
    /* tile coding parameter*/
    opj_tcp_t *l_tcp = 00;
    /* current poc being updated*/
    opj_poc_t * l_current_poc = 00;

    /* number of pocs*/
    OPJ_UINT32 l_poc_bound;

    OPJ_ARG_NOT_USED(p_max_res);

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps [p_tileno];
    /* number of iterations in the loop */
    l_poc_bound = l_tcp->numpocs + 1;

    /* start at first element, and to make sure the compiler will not make a calculation each time in the loop
       store a pointer to the current element to modify rather than l_tcp->pocs[i]*/
    l_current_poc = l_tcp->pocs;

    l_current_poc->compS = l_current_poc->compno0;
    l_current_poc->compE = l_current_poc->compno1;
    l_current_poc->resS = l_current_poc->resno0;
    l_current_poc->resE = l_current_poc->resno1;
    l_current_poc->layE = l_current_poc->layno1;

    /* special treatment for the first element*/
    l_current_poc->layS = 0;
    l_current_poc->prg  = l_current_poc->prg1;
    l_current_poc->prcS = 0;

    l_current_poc->prcE = p_max_prec;
    l_current_poc->txS = (OPJ_UINT32)p_tx0;
    l_current_poc->txE = (OPJ_UINT32)p_tx1;
    l_current_poc->tyS = (OPJ_UINT32)p_ty0;
    l_current_poc->tyE = (OPJ_UINT32)p_ty1;
    l_current_poc->dx = p_dx_min;
    l_current_poc->dy = p_dy_min;

    ++ l_current_poc;
    for (pino = 1; pino < l_poc_bound ; ++pino) {
        l_current_poc->compS = l_current_poc->compno0;
        l_current_poc->compE = l_current_poc->compno1;
        l_current_poc->resS = l_current_poc->resno0;
        l_current_poc->resE = l_current_poc->resno1;
        l_current_poc->layE = l_current_poc->layno1;
        l_current_poc->prg  = l_current_poc->prg1;
        l_current_poc->prcS = 0;
        /* special treatment here different from the first element*/
        l_current_poc->layS = (l_current_poc->layE > (l_current_poc - 1)->layE) ?
                              l_current_poc->layE : 0;

        l_current_poc->prcE = p_max_prec;
        l_current_poc->txS = (OPJ_UINT32)p_tx0;
        l_current_poc->txE = (OPJ_UINT32)p_tx1;
        l_current_poc->tyS = (OPJ_UINT32)p_ty0;
        l_current_poc->tyE = (OPJ_UINT32)p_ty1;
        l_current_poc->dx = p_dx_min;
        l_current_poc->dy = p_dy_min;
        ++ l_current_poc;
    }
}